

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

bool __thiscall QMdiArea::eventFilter(QMdiArea *this,QObject *object,QEvent *event)

{
  int iVar1;
  QMdiAreaPrivate *pQVar2;
  Data *pDVar3;
  QMdiAreaTabBar *pQVar4;
  bool bVar5;
  short sVar6;
  uint uVar7;
  QMdiArea *pQVar8;
  QWidget *pQVar9;
  qsizetype qVar10;
  QObject *pQVar11;
  long in_FS_OFFSET;
  undefined1 auStack_58 [24];
  QMdiSubWindow *subWindow;
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  if (object == (QObject *)0x0) {
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
      object = (QObject *)0x0;
      goto LAB_0040f6db;
    }
    goto LAB_0040f806;
  }
  if ((*(ushort *)(event + 8) & 0xfffe) == 6) {
    uVar7 = QKeyEvent::modifiers();
    pQVar11 = object;
    if (((uVar7 >> 0x1a & 1) == 0) && (*(int *)(event + 0x40) != 0x1000021)) {
LAB_0040f6c1:
      if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
LAB_0040f6db:
        bVar5 = QAbstractScrollArea::eventFilter((QAbstractScrollArea *)this,object,event);
        return bVar5;
      }
      goto LAB_0040f806;
    }
    do {
      pQVar11 = *(QObject **)(*(long *)(pQVar11 + 8) + 0x10);
      if (pQVar11 == (QObject *)0x0) goto LAB_0040f6c1;
      pQVar8 = QtPrivate::qobject_cast_helper<QMdiArea*,QObject>(pQVar11);
    } while (pQVar8 == (QMdiArea *)0x0);
    iVar1 = *(int *)(event + 0x40);
    if (1 < iVar1 + 0xfeffffffU) {
      if (iVar1 == 0x1000000) {
        QMdiAreaPrivate::hideRubberBand
                  (*(QMdiAreaPrivate **)
                    &(pQVar8->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8);
      }
      else if (iVar1 == 0x1000021) {
        pQVar2 = *(QMdiAreaPrivate **)
                  &(pQVar8->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
        if (*(short *)(event + 8) == 6) {
          QMdiAreaPrivate::startTabToPreviousTimer(pQVar2);
        }
        else {
          QMdiAreaPrivate::activateHighlightedWindow(pQVar2);
        }
      }
      goto LAB_0040f6c1;
    }
    bVar5 = true;
    if (*(short *)(event + 8) == 6) {
      QMdiAreaPrivate::highlightNextSubWindow
                (*(QMdiAreaPrivate **)
                  &(pQVar8->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8,
                 (uint)(iVar1 == 0x1000001) * 2 + -1);
    }
  }
  else {
    pQVar2 = *(QMdiAreaPrivate **)
              &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
    pQVar9 = &QtPrivate::qobject_cast_helper<QMdiSubWindow*,QObject>(object)->super_QWidget;
    subWindow = (QMdiSubWindow *)pQVar9;
    if (pQVar9 == (QWidget *)0x0) {
      sVar6 = *(short *)(event + 8);
      if (sVar6 == 0x79) {
        bVar5 = QPointer::operator_cast_to_bool((QPointer *)&pQVar2->active);
        if ((!bVar5) &&
           ((((this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->widget_attributes
            & 0x8000) != 0)) {
          pQVar9 = QWidget::window((QWidget *)this);
          bVar5 = QWidget::isMinimized(pQVar9);
          if (!bVar5) {
            QMdiAreaPrivate::activateCurrentWindow(pQVar2);
            goto switchD_0040f54d_caseD_f;
          }
        }
        sVar6 = *(short *)(event + 8);
      }
      if (sVar6 == 0x7a) {
        bVar5 = QPointer::operator_cast_to_bool((QPointer *)&pQVar2->active);
        if (bVar5) {
          pDVar3 = (pQVar2->active).wp.d;
          if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
            pQVar11 = (QObject *)0x0;
          }
          else {
            pQVar11 = (pQVar2->active).wp.value;
          }
          QMdiAreaPrivate::setActive(pQVar2,(QMdiSubWindow *)pQVar11,false,false);
        }
      }
      goto switchD_0040f54d_caseD_f;
    }
    pQVar8 = QMdiSubWindow::mdiArea((QMdiSubWindow *)pQVar9);
    if (pQVar8 != this) goto switchD_0040f54d_caseD_f;
    sVar6 = *(short *)(event + 8);
    switch(sVar6) {
    case 0xd:
    case 0xe:
      if (pQVar2->tileCalledFromResizeEvent != false) break;
      QMdiAreaPrivate::updateScrollBars(pQVar2);
      bVar5 = QWidget::isMinimized(pQVar9);
      if (bVar5) break;
      goto LAB_0040f772;
    case 0xf:
    case 0x10:
      break;
    case 0x11:
      if (pQVar2->tabBar != (QMdiAreaTabBar *)0x0) {
        qVar10 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                           (&pQVar2->childWindows,&subWindow,0);
        bVar5 = QTabBar::isTabEnabled(&pQVar2->tabBar->super_QTabBar,(int)qVar10);
        if (!bVar5) {
          QTabBar::setTabEnabled(&pQVar2->tabBar->super_QTabBar,(int)qVar10,true);
        }
      }
    case 0x12:
      if (event[0xb] == (QEvent)0x0) {
LAB_0040f772:
        pQVar2->isSubWindowsTiled = false;
      }
      break;
    case 0x13:
      qVar10 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                         (&pQVar2->childWindows,&subWindow,0);
      if (qVar10 == pQVar2->indexToHighlighted) {
        QMdiAreaPrivate::hideRubberBand(pQVar2);
      }
      break;
    default:
      if (sVar6 == 0x21) {
LAB_0040f647:
        pQVar4 = pQVar2->tabBar;
        if (pQVar4 != (QMdiAreaTabBar *)0x0) {
          qVar10 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                             (&pQVar2->childWindows,&subWindow,0);
          tabTextFor((QString *)auStack_58,subWindow);
          QTabBar::setTabText(&pQVar4->super_QTabBar,(int)qVar10,(QString *)auStack_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_58)
          ;
        }
      }
      else if (sVar6 == 0x22) {
        pQVar4 = pQVar2->tabBar;
        if (pQVar4 != (QMdiAreaTabBar *)0x0) {
          qVar10 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                             (&pQVar2->childWindows,&subWindow,0);
          QWidget::windowIcon((QWidget *)auStack_58);
          QTabBar::setTabIcon(&pQVar4->super_QTabBar,(int)qVar10,(QIcon *)auStack_58);
          QIcon::~QIcon((QIcon *)auStack_58);
        }
      }
      else if (sVar6 == 0x66) goto LAB_0040f647;
    }
switchD_0040f54d_caseD_f:
    bVar5 = QAbstractScrollArea::eventFilter((QAbstractScrollArea *)this,object,event);
  }
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
LAB_0040f806:
  __stack_chk_fail();
}

Assistant:

bool QMdiArea::eventFilter(QObject *object, QEvent *event)
{
    if (!object)
        return QAbstractScrollArea::eventFilter(object, event);

    Q_D(QMdiArea);
    // Global key events with Ctrl modifier.
    if (event->type() == QEvent::KeyPress || event->type() == QEvent::KeyRelease) {

        QKeyEvent *keyEvent = static_cast<QKeyEvent *>(event);
        // Ignore key events without a Ctrl modifier (except for press/release on the modifier itself).
        if (!(keyEvent->modifiers() & Qt::ControlModifier) && keyEvent->key() != Qt::Key_Control)
            return QAbstractScrollArea::eventFilter(object, event);

        // Find closest mdi area (in case we have a nested workspace).
        QMdiArea *area = mdiAreaParent(static_cast<QWidget *>(object));
        if (!area)
            return QAbstractScrollArea::eventFilter(object, event);

        const bool keyPress = (event->type() == QEvent::KeyPress);

        // 1) Ctrl-Tab once -> activate the previously active window.
        // 2) Ctrl-Tab (Tab, Tab, ...) -> iterate through all windows (activateNextSubWindow()).
        // 3) Ctrl-Shift-Tab (Tab, Tab, ...) -> iterate through all windows in the opposite
        //    direction (activatePreviousSubWindow())
        switch (keyEvent->key()) {
        case Qt::Key_Control:
            if (keyPress)
                area->d_func()->startTabToPreviousTimer();
            else
                area->d_func()->activateHighlightedWindow();
            break;
        case Qt::Key_Tab:
        case Qt::Key_Backtab:
            if (keyPress)
                area->d_func()->highlightNextSubWindow(keyEvent->key() == Qt::Key_Tab ? 1 : -1);
            return true;
#if QT_CONFIG(rubberband)
        case Qt::Key_Escape:
            area->d_func()->hideRubberBand();
            break;
#endif
        default:
            break;
        }
        return QAbstractScrollArea::eventFilter(object, event);
    }

    QMdiSubWindow *subWindow = qobject_cast<QMdiSubWindow *>(object);

    if (!subWindow) {
        // QApplication events:
        if (event->type() == QEvent::ApplicationActivate && !d->active
            && isVisible() && !window()->isMinimized()) {
            d->activateCurrentWindow();
        } else if (event->type() == QEvent::ApplicationDeactivate && d->active) {
            d->setActive(d->active, false, false);
        }
        return QAbstractScrollArea::eventFilter(object, event);
    }

    if (subWindow->mdiArea() != this)
        return QAbstractScrollArea::eventFilter(object, event);

    // QMdiSubWindow events:
    switch (event->type()) {
    case QEvent::Move:
    case QEvent::Resize:
        if (d->tileCalledFromResizeEvent)
            break;
        d->updateScrollBars();
        if (!subWindow->isMinimized())
            d->isSubWindowsTiled = false;
        break;
    case QEvent::Show:
#if QT_CONFIG(tabbar)
        if (d->tabBar) {
            const int tabIndex = d->childWindows.indexOf(subWindow);
            if (!d->tabBar->isTabEnabled(tabIndex))
                d->tabBar->setTabEnabled(tabIndex, true);
        }
#endif // QT_CONFIG(tabbar)
        Q_FALLTHROUGH();
    case QEvent::Hide:
        // Do not reset the isSubWindowsTiled flag if the event is a spontaneous system window event.
        // This ensures that tiling will be performed during the resizeEvent after an application
        // window minimize (hide) and then restore (show).
        if (!event->spontaneous())
            d->isSubWindowsTiled = false;
        break;
#if QT_CONFIG(rubberband)
    case QEvent::Close:
        if (d->childWindows.indexOf(subWindow) == d->indexToHighlighted)
            d->hideRubberBand();
        break;
#endif
#if QT_CONFIG(tabbar)
    case QEvent::WindowTitleChange:
    case QEvent::ModifiedChange:
        if (d->tabBar)
            d->tabBar->setTabText(d->childWindows.indexOf(subWindow), tabTextFor(subWindow));
        break;
    case QEvent::WindowIconChange:
        if (d->tabBar)
            d->tabBar->setTabIcon(d->childWindows.indexOf(subWindow), subWindow->windowIcon());
        break;
#endif // QT_CONFIG(tabbar)
    default:
        break;
    }
    return QAbstractScrollArea::eventFilter(object, event);
}